

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.h
# Opt level: O2

int ms5837_write_command(MS5837 *pMS5837,uint8_t cmd)

{
  int iVar1;
  int iVar2;
  uint8_t local_11;
  
  iVar2 = 1;
  local_11 = cmd;
  iVar1 = WriteAllI2CBus(&pMS5837->I2CBus,&local_11,1);
  if (((iVar1 == 0) && (iVar2 = 0, pMS5837->bSaveRawData != 0)) &&
     ((FILE *)pMS5837->pfSaveFile != (FILE *)0x0)) {
    fputc((int)(char)local_11,(FILE *)pMS5837->pfSaveFile);
    fflush((FILE *)pMS5837->pfSaveFile);
  }
  return iVar2;
}

Assistant:

inline int ms5837_write_command(MS5837* pMS5837, uint8_t cmd)
{
	unsigned char sendbuf[1];
	int sendbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)cmd;
	sendbuflen = 1;

	if (WriteAllI2CBus(&pMS5837->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pMS5837->bSaveRawData)&&(pMS5837->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pMS5837->pfSaveFile);
		fflush(pMS5837->pfSaveFile);
	}

	return EXIT_SUCCESS;
}